

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

string * __thiscall
glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::
getTessellationControlShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,
          TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this,
          bool should_pass_pointsize_data,GLfloat *inner_tess_levels,GLfloat *outer_tess_levels)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream result_code;
  stringstream asStack_1b8 [16];
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  std::operator<<(&local_1a8,"${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n");
  if (should_pass_pointsize_data) {
    std::operator<<(&local_1a8,"${TESSELLATION_POINT_SIZE_REQUIRE}\n");
  }
  poVar1 = std::operator<<(&local_1a8,"\nlayout(vertices = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_gl_max_patch_vertices_value);
  std::operator<<(poVar1,") out;\n\n");
  if (should_pass_pointsize_data) {
    std::operator<<(&local_1a8,"${IN_PER_VERTEX_DECL_POINT_SIZE}");
    pcVar2 = "${OUT_PER_VERTEX_DECL_POINT_SIZE}";
  }
  else {
    std::operator<<(&local_1a8,"${IN_PER_VERTEX_DECL}");
    pcVar2 = "${OUT_PER_VERTEX_DECL}";
  }
  std::operator<<(&local_1a8,pcVar2);
  std::operator<<(&local_1a8,
                  "out OUT_TC\n{\n     vec2 value1;\n    ivec4 value2;\n} result[];\n\nvoid main()\n{\n"
                 );
  if (should_pass_pointsize_data) {
    std::operator<<(&local_1a8,
                    "    gl_out[gl_InvocationID].gl_PointSize = 1.0 / float(gl_InvocationID + 1);\n"
                   );
  }
  poVar1 = std::operator<<(&local_1a8,
                           "    gl_out[gl_InvocationID].gl_Position =  vec4(      float(gl_InvocationID * 4 + 0),   float(gl_InvocationID * 4 + 1),\n                                                      float(gl_InvocationID * 4 + 2),   float(gl_InvocationID * 4 + 3));\n    result[gl_InvocationID].value1      =  vec2(1.0 / float(gl_InvocationID + 1), 1.0 / float(gl_InvocationID + 2) );\n    result[gl_InvocationID].value2      = ivec4(            gl_InvocationID + 1,              gl_InvocationID + 2,\n                                                            gl_InvocationID + 3,              gl_InvocationID + 4);\n\n    gl_TessLevelInner[0] = float("
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*inner_tess_levels);
  poVar1 = std::operator<<(poVar1,");\n    gl_TessLevelInner[1] = float(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,inner_tess_levels[1]);
  poVar1 = std::operator<<(poVar1,");\n    gl_TessLevelOuter[0] = float(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*outer_tess_levels);
  poVar1 = std::operator<<(poVar1,");\n    gl_TessLevelOuter[1] = float(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,outer_tess_levels[1]);
  poVar1 = std::operator<<(poVar1,");\n    gl_TessLevelOuter[2] = float(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,outer_tess_levels[2]);
  poVar1 = std::operator<<(poVar1,");\n    gl_TessLevelOuter[3] = float(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,outer_tess_levels[3]);
  std::operator<<(poVar1,");\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::getTessellationControlShaderCode(
	bool should_pass_pointsize_data, const glw::GLfloat* inner_tess_levels, const glw::GLfloat* outer_tess_levels)
{
	std::stringstream result_code;

	result_code << "${VERSION}\n"
				   "\n"
				   "${TESSELLATION_SHADER_REQUIRE}\n";

	if (should_pass_pointsize_data)
	{
		result_code << "${TESSELLATION_POINT_SIZE_REQUIRE}\n";
	}

	result_code << "\n"
				   "layout(vertices = "
				<< m_gl_max_patch_vertices_value << ") out;\n"
													"\n";
	if (should_pass_pointsize_data)
	{
		result_code << "${IN_PER_VERTEX_DECL_POINT_SIZE}";
		result_code << "${OUT_PER_VERTEX_DECL_POINT_SIZE}";
	}
	else
	{
		result_code << "${IN_PER_VERTEX_DECL}";
		result_code << "${OUT_PER_VERTEX_DECL}";
	}
	result_code << "out OUT_TC\n"
				   "{\n"
				   "     vec2 value1;\n"
				   "    ivec4 value2;\n"
				   "} result[];\n"
				   "\n"
				   "void main()\n"
				   "{\n";

	if (should_pass_pointsize_data)
	{
		result_code << "    gl_out[gl_InvocationID].gl_PointSize = 1.0 / float(gl_InvocationID + 1);\n";
	}

	result_code << "    gl_out[gl_InvocationID].gl_Position =  vec4(      float(gl_InvocationID * 4 + 0),   "
				   "float(gl_InvocationID * 4 + 1),\n"
				   "                                                      float(gl_InvocationID * 4 + 2),   "
				   "float(gl_InvocationID * 4 + 3));\n"
				   "    result[gl_InvocationID].value1      =  vec2(1.0 / float(gl_InvocationID + 1), 1.0 / "
				   "float(gl_InvocationID + 2) );\n"
				   "    result[gl_InvocationID].value2      = ivec4(            gl_InvocationID + 1,              "
				   "gl_InvocationID + 2,\n"
				   "                                                            gl_InvocationID + 3,              "
				   "gl_InvocationID + 4);\n"
				   "\n"
				   "    gl_TessLevelInner[0] = float("
				<< inner_tess_levels[0] << ");\n"
										   "    gl_TessLevelInner[1] = float("
				<< inner_tess_levels[1] << ");\n"
										   "    gl_TessLevelOuter[0] = float("
				<< outer_tess_levels[0] << ");\n"
										   "    gl_TessLevelOuter[1] = float("
				<< outer_tess_levels[1] << ");\n"
										   "    gl_TessLevelOuter[2] = float("
				<< outer_tess_levels[2] << ");\n"
										   "    gl_TessLevelOuter[3] = float("
				<< outer_tess_levels[3] << ");\n"
										   "}\n";

	return result_code.str();
}